

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O0

uchar * trial::protocol::json::detail::scan_narrow<unsigned_char>(uchar *marker,uchar *tail)

{
  undefined1 auVar1 [16];
  uint x;
  int iVar2;
  category cVar3;
  ulong uVar4;
  ulong uVar5;
  int mask;
  __m128i avoid;
  __m128i data;
  __m128i escape;
  __m128i lower;
  __m128i permuter;
  uchar *tail_local;
  uchar *marker_local;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  
  tail_local = marker;
  while( true ) {
    if ((long)tail - (long)tail_local < 0x11) {
      while ((tail_local != tail &&
             (cVar3 = traits::to_category<unsigned_char>(*tail_local), cVar3 == narrow))) {
        tail_local = tail_local + 1;
      }
      return tail_local;
    }
    uVar4 = *(ulong *)tail_local ^ 0x202020202020202;
    uVar5 = *(ulong *)(tail_local + 8) ^ 0x202020202020202;
    local_c8 = (char)uVar4;
    cStack_c7 = (char)(uVar4 >> 8);
    cStack_c6 = (char)(uVar4 >> 0x10);
    cStack_c5 = (char)(uVar4 >> 0x18);
    cStack_c4 = (char)(uVar4 >> 0x20);
    cStack_c3 = (char)(uVar4 >> 0x28);
    cStack_c2 = (char)(uVar4 >> 0x30);
    cStack_c1 = (char)(uVar4 >> 0x38);
    cStack_c0 = (char)uVar5;
    cStack_bf = (char)(uVar5 >> 8);
    cStack_be = (char)(uVar5 >> 0x10);
    cStack_bd = (char)(uVar5 >> 0x18);
    cStack_bc = (char)(uVar5 >> 0x20);
    cStack_bb = (char)(uVar5 >> 0x28);
    cStack_ba = (char)(uVar5 >> 0x30);
    cStack_b9 = (char)(uVar5 >> 0x38);
    uVar4 = CONCAT17(-(cStack_b9 == '^'),
                     CONCAT16(-(cStack_ba == '^'),
                              CONCAT15(-(cStack_bb == '^'),
                                       CONCAT14(-(cStack_bc == '^'),
                                                CONCAT13(-(cStack_bd == '^'),
                                                         CONCAT12(-(cStack_be == '^'),
                                                                  CONCAT11(-(cStack_bf == '^'),
                                                                           -(cStack_c0 == '^')))))))
                    ) |
            CONCAT17(-(cStack_b9 < '!'),
                     CONCAT16(-(cStack_ba < '!'),
                              CONCAT15(-(cStack_bb < '!'),
                                       CONCAT14(-(cStack_bc < '!'),
                                                CONCAT13(-(cStack_bd < '!'),
                                                         CONCAT12(-(cStack_be < '!'),
                                                                  CONCAT11(-(cStack_bf < '!'),
                                                                           -(cStack_c0 < '!'))))))))
    ;
    auVar1._8_8_ = uVar4;
    auVar1._0_8_ = CONCAT17(-(cStack_c1 == '^'),
                            CONCAT16(-(cStack_c2 == '^'),
                                     CONCAT15(-(cStack_c3 == '^'),
                                              CONCAT14(-(cStack_c4 == '^'),
                                                       CONCAT13(-(cStack_c5 == '^'),
                                                                CONCAT12(-(cStack_c6 == '^'),
                                                                         CONCAT11(-(cStack_c7 == '^'
                                                                                   ),-(local_c8 ==
                                                                                      '^')))))))) |
                   CONCAT17(-(cStack_c1 < '!'),
                            CONCAT16(-(cStack_c2 < '!'),
                                     CONCAT15(-(cStack_c3 < '!'),
                                              CONCAT14(-(cStack_c4 < '!'),
                                                       CONCAT13(-(cStack_c5 < '!'),
                                                                CONCAT12(-(cStack_c6 < '!'),
                                                                         CONCAT11(-(cStack_c7 < '!')
                                                                                  ,-(local_c8 < '!')
                                                                                 )))))));
    x = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                       (ushort)((byte)(uVar4 >> 7) & 1) << 8 |
                       (ushort)((byte)(uVar4 >> 0xf) & 1) << 9 |
                       (ushort)((byte)(uVar4 >> 0x17) & 1) << 10 |
                       (ushort)((byte)(uVar4 >> 0x1f) & 1) << 0xb |
                       (ushort)((byte)(uVar4 >> 0x27) & 1) << 0xc |
                       (ushort)((byte)(uVar4 >> 0x2f) & 1) << 0xd |
                       (ushort)((byte)(uVar4 >> 0x37) & 1) << 0xe |
                      (ushort)(byte)(uVar4 >> 0x3f) << 0xf);
    if (x != 0) break;
    tail_local = tail_local + 0x10;
  }
  iVar2 = core::detail::countr_zero<int>(x);
  return tail_local + iVar2;
}

Assistant:

auto scan_narrow(const CharT *marker,
                 const CharT * const tail) noexcept -> const CharT *
{
#if defined(TRIAL_PROTOCOL_USE_SSE2)
    // Swaps space and quote characters
    const auto permuter = _mm_set1_epi8(0x02);
    // Covers permuted quote and control characters + extra characters
    const auto lower = _mm_set1_epi8(0x21);
    const auto escape = _mm_set1_epi8(0x5e);
    while (tail - marker > 16)
    {
        const auto data = _mm_xor_si128(_mm_loadu_si128((const __m128i *)marker),
                                        permuter);
        const auto avoid = _mm_or_si128(_mm_cmpeq_epi8(data, escape),
                                        _mm_cmplt_epi8(data, lower));
        const auto mask = _mm_movemask_epi8(avoid);
        if (mask != 0)
            return marker + core::detail::countr_zero(mask);
        marker += 16;
    }
#endif

    while (marker != tail)
    {
        if (traits::to_category(*marker) == traits::category::narrow)
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}